

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

uint portInfo(snd_seq_t *seq,snd_seq_port_info_t *pinfo,uint type,int portNumber)

{
  undefined4 in_EAX;
  int iVar1;
  uint uVar2;
  long lVar3;
  size_t __n;
  ulong uVar4;
  void *__s;
  uint uVar5;
  undefined8 uStack_40;
  undefined4 uStack_38;
  uint local_34;
  
  _uStack_38 = CONCAT44(type,in_EAX);
  uStack_40 = 0x18ca5a;
  lVar3 = snd_seq_client_info_sizeof();
  lVar3 = -(lVar3 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&uStack_38 + lVar3);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18ca70;
  __n = snd_seq_client_info_sizeof();
  uVar5 = 0;
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18ca80;
  memset(__s,0,__n);
  *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18ca8d;
  snd_seq_client_info_set_client(__s,0xffffffff);
  do {
    do {
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18ca98;
      iVar1 = snd_seq_query_next_client(seq,__s);
      if (iVar1 < 0) {
        return portNumber >> 0x1f & uVar5;
      }
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18caa4;
      iVar1 = snd_seq_client_info_get_client(__s);
    } while (iVar1 == 0);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18cab2;
    snd_seq_port_info_set_client(pinfo,iVar1);
    *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18cabf;
    snd_seq_port_info_set_port(pinfo,0xffffffff);
    while( true ) {
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18caca;
      iVar1 = snd_seq_query_next_port(seq,pinfo);
      if (iVar1 < 0) break;
      *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18cad6;
      uVar4 = snd_seq_port_info_get_type(pinfo);
      if ((uVar4 & 0x100402) != 0) {
        *(undefined8 *)((long)&uStack_40 + lVar3) = 0x18cae5;
        uVar2 = snd_seq_port_info_get_capability(pinfo);
        if ((local_34 & ~uVar2) == 0) {
          if (uVar5 == portNumber) {
            return 1;
          }
          uVar5 = uVar5 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

unsigned int portInfo( snd_seq_t *seq, snd_seq_port_info_t *pinfo, unsigned int type, int portNumber )
{
  snd_seq_client_info_t *cinfo;
  int client;
  int count = 0;
  snd_seq_client_info_alloca( &cinfo );

  snd_seq_client_info_set_client( cinfo, -1 );
  while ( snd_seq_query_next_client( seq, cinfo ) >= 0 ) {
    client = snd_seq_client_info_get_client( cinfo );
    if ( client == 0 ) continue;
    // Reset query info
    snd_seq_port_info_set_client( pinfo, client );
    snd_seq_port_info_set_port( pinfo, -1 );
    while ( snd_seq_query_next_port( seq, pinfo ) >= 0 ) {
      unsigned int atyp = snd_seq_port_info_get_type( pinfo );
      if ( ( ( atyp & SND_SEQ_PORT_TYPE_MIDI_GENERIC ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_SYNTH ) == 0 ) &&
           ( ( atyp & SND_SEQ_PORT_TYPE_APPLICATION ) == 0 ) ) continue;

      unsigned int caps = snd_seq_port_info_get_capability( pinfo );
      if ( ( caps & type ) != type ) continue;
      if ( count == portNumber ) return 1;
      ++count;
    }
  }

  // If a negative portNumber was used, return the port count.
  if ( portNumber < 0 ) return count;
  return 0;
}